

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

int run_test_tcp_open_twice(void)

{
  uv_os_sock_t sock;
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uint sock_00;
  int extraout_EAX_03;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  uv_timer_t *loop;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  code *tcp;
  uv_shutdown_t *loop_00;
  uv_write_t *puVar5;
  uv_handle_t *handle;
  uv_connect_t *loop_01;
  uv_tcp_t *puVar6;
  uv_tcp_t client;
  uv_buf_t uStack_398;
  uv_loop_t *puStack_388;
  sockaddr_in sStack_380;
  uv_loop_t *puStack_370;
  code *pcStack_368;
  code *pcStack_360;
  code *pcStack_358;
  code *pcStack_350;
  uv_buf_t uStack_340;
  undefined1 auStack_330 [16];
  undefined1 auStack_320 [264];
  sockaddr_in sStack_218;
  uv_tcp_t uStack_208;
  uv_loop_t *puStack_110;
  uv_tcp_t uStack_108;
  
  puStack_110 = (uv_loop_t *)0x170855;
  sock = create_tcp_socket();
  puStack_110 = (uv_loop_t *)0x17085c;
  uVar1 = create_tcp_socket();
  puVar4 = (uv_loop_t *)(ulong)uVar1;
  puStack_110 = (uv_loop_t *)0x170863;
  puVar3 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x17086e;
  iVar2 = uv_tcp_init(puVar3,&uStack_108);
  if (iVar2 == 0) {
    puStack_110 = (uv_loop_t *)0x170880;
    iVar2 = uv_tcp_open(&uStack_108,sock);
    if (iVar2 != 0) goto LAB_001708fc;
    puStack_110 = (uv_loop_t *)0x17088e;
    iVar2 = uv_tcp_open(&uStack_108,uVar1);
    if (iVar2 != -0x10) goto LAB_00170901;
    puStack_110 = (uv_loop_t *)0x17089a;
    iVar2 = close(uVar1);
    if (iVar2 != 0) goto LAB_00170906;
    puStack_110 = (uv_loop_t *)0x1708a8;
    uv_close((uv_handle_t *)&uStack_108,(uv_close_cb)0x0);
    puStack_110 = (uv_loop_t *)0x1708ad;
    puVar3 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1708b7;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_110 = (uv_loop_t *)0x1708bc;
    puVar4 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1708d0;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_110 = (uv_loop_t *)0x1708da;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_110 = (uv_loop_t *)0x1708df;
    puVar3 = uv_default_loop();
    puStack_110 = (uv_loop_t *)0x1708e7;
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_110 = (uv_loop_t *)0x1708fc;
    run_test_tcp_open_twice_cold_1();
LAB_001708fc:
    puStack_110 = (uv_loop_t *)0x170901;
    run_test_tcp_open_twice_cold_2();
LAB_00170901:
    puStack_110 = (uv_loop_t *)0x170906;
    run_test_tcp_open_twice_cold_3();
LAB_00170906:
    puStack_110 = (uv_loop_t *)0x17090b;
    run_test_tcp_open_twice_cold_4();
  }
  puStack_110 = (uv_loop_t *)run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  auStack_320._248_8_ = (void *)0x17091d;
  puStack_110 = puVar4;
  uVar1 = create_tcp_socket();
  puVar3 = (uv_loop_t *)(ulong)uVar1;
  auStack_320._248_8_ = (void *)0x170935;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_218);
  if (iVar2 == 0) {
    auStack_320._248_8_ = (void *)0x170942;
    puVar4 = uv_default_loop();
    auStack_320._248_8_ = (void *)0x17094f;
    iVar2 = uv_tcp_init(puVar4,&uStack_208);
    if (iVar2 != 0) goto LAB_001709d1;
    auStack_320._248_8_ = (void *)0x170964;
    iVar2 = bind(uVar1,(sockaddr *)&sStack_218,0x10);
    if (iVar2 != 0) goto LAB_001709d6;
    auStack_320._248_8_ = (void *)0x170974;
    iVar2 = uv_tcp_open(&uStack_208,uVar1);
    if (iVar2 != 0) goto LAB_001709db;
    auStack_320._248_8_ = (void *)0x170989;
    iVar2 = uv_listen((uv_stream_t *)&uStack_208,0x80,(uv_connection_cb)0x0);
    if (iVar2 != 0) goto LAB_001709e0;
    auStack_320._248_8_ = (void *)0x170992;
    puVar3 = uv_default_loop();
    auStack_320._248_8_ = (void *)0x1709a6;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    auStack_320._248_8_ = (void *)0x1709b0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_320._248_8_ = (void *)0x1709b5;
    puVar4 = uv_default_loop();
    auStack_320._248_8_ = (void *)0x1709bd;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    auStack_320._248_8_ = (void *)0x1709d1;
    run_test_tcp_open_bound_cold_1();
LAB_001709d1:
    auStack_320._248_8_ = (void *)0x1709d6;
    run_test_tcp_open_bound_cold_2();
LAB_001709d6:
    auStack_320._248_8_ = (void *)0x1709db;
    run_test_tcp_open_bound_cold_3();
LAB_001709db:
    auStack_320._248_8_ = (void *)0x1709e0;
    run_test_tcp_open_bound_cold_4();
LAB_001709e0:
    auStack_320._248_8_ = (void *)0x1709e5;
    run_test_tcp_open_bound_cold_5();
  }
  auStack_320._248_8_ = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_350 = (code *)0x170a03;
  auStack_320._248_8_ = puVar3;
  uStack_340 = uv_buf_init("PING",4);
  loop_00 = (uv_shutdown_t *)0x1a4b5a;
  tcp = (code *)0x23a3;
  pcStack_350 = (code *)0x170a23;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)auStack_330);
  if (iVar2 == 0) {
    pcStack_350 = (code *)0x170a30;
    uVar1 = create_tcp_socket();
    puVar3 = (uv_loop_t *)(ulong)uVar1;
    tcp = (code *)auStack_330;
    loop_00 = (uv_shutdown_t *)(ulong)uVar1;
    pcStack_350 = (code *)0x170a43;
    iVar2 = connect(uVar1,(sockaddr *)tcp,0x10);
    if (iVar2 != 0) goto LAB_00170b51;
    pcStack_350 = (code *)0x170a50;
    loop_00 = (uv_shutdown_t *)uv_default_loop();
    tcp = (code *)auStack_320;
    pcStack_350 = (code *)0x170a5d;
    iVar2 = uv_tcp_init((uv_loop_t *)loop_00,(uv_tcp_t *)tcp);
    if (iVar2 != 0) goto LAB_00170b56;
    loop_00 = (uv_shutdown_t *)auStack_320;
    tcp = (code *)(ulong)uVar1;
    pcStack_350 = (code *)0x170a71;
    iVar2 = uv_tcp_open((uv_tcp_t *)loop_00,uVar1);
    if (iVar2 != 0) goto LAB_00170b5b;
    puVar5 = &write_req;
    tcp = (code *)auStack_320;
    pcStack_350 = (code *)0x170a9b;
    iVar2 = uv_write(&write_req,(uv_stream_t *)tcp,&uStack_340,1,write_cb);
    loop_00 = (uv_shutdown_t *)puVar5;
    if (iVar2 != 0) goto LAB_00170b60;
    loop_00 = &shutdown_req;
    tcp = (code *)auStack_320;
    pcStack_350 = (code *)0x170abb;
    iVar2 = uv_shutdown(&shutdown_req,(uv_stream_t *)tcp,shutdown_cb);
    if (iVar2 != 0) goto LAB_00170b65;
    tcp = alloc_cb;
    loop_00 = (uv_shutdown_t *)auStack_320;
    pcStack_350 = (code *)0x170adb;
    iVar2 = uv_read_start((uv_stream_t *)loop_00,alloc_cb,read_cb);
    if (iVar2 != 0) goto LAB_00170b6a;
    pcStack_350 = (code *)0x170ae8;
    loop_00 = (uv_shutdown_t *)uv_default_loop();
    tcp = (code *)0x0;
    pcStack_350 = (code *)0x170af2;
    uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (shutdown_cb_called != 1) goto LAB_00170b6f;
    if (write_cb_called != 1) goto LAB_00170b74;
    if (close_cb_called != 1) goto LAB_00170b79;
    pcStack_350 = (code *)0x170b12;
    puVar3 = uv_default_loop();
    pcStack_350 = (code *)0x170b26;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    tcp = (code *)0x0;
    pcStack_350 = (code *)0x170b30;
    uv_run(puVar3,UV_RUN_DEFAULT);
    pcStack_350 = (code *)0x170b35;
    loop_00 = (uv_shutdown_t *)uv_default_loop();
    pcStack_350 = (code *)0x170b3d;
    iVar2 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_350 = (code *)0x170b51;
    run_test_tcp_open_connected_cold_1();
LAB_00170b51:
    pcStack_350 = (code *)0x170b56;
    run_test_tcp_open_connected_cold_2();
LAB_00170b56:
    pcStack_350 = (code *)0x170b5b;
    run_test_tcp_open_connected_cold_3();
LAB_00170b5b:
    pcStack_350 = (code *)0x170b60;
    run_test_tcp_open_connected_cold_4();
LAB_00170b60:
    pcStack_350 = (code *)0x170b65;
    run_test_tcp_open_connected_cold_5();
LAB_00170b65:
    pcStack_350 = (code *)0x170b6a;
    run_test_tcp_open_connected_cold_6();
LAB_00170b6a:
    pcStack_350 = (code *)0x170b6f;
    run_test_tcp_open_connected_cold_7();
LAB_00170b6f:
    pcStack_350 = (code *)0x170b74;
    run_test_tcp_open_connected_cold_8();
LAB_00170b74:
    pcStack_350 = (code *)0x170b79;
    run_test_tcp_open_connected_cold_9();
LAB_00170b79:
    pcStack_350 = (code *)0x170b7e;
    run_test_tcp_open_connected_cold_10();
  }
  pcStack_350 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if ((uv_loop_t *)loop_00 == (uv_loop_t *)0x0) {
    pcStack_358 = (code *)0x170b9a;
    write_cb_cold_2();
  }
  else if ((int)tcp == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  handle = (uv_handle_t *)((ulong)tcp & 0xffffffff);
  pcStack_358 = shutdown_cb;
  write_cb_cold_1();
  if (handle == (uv_handle_t *)&shutdown_req) {
    if ((int)tcp == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_360 = (code *)0x170bbf;
    shutdown_cb_cold_1();
  }
  pcStack_360 = alloc_cb;
  shutdown_cb_cold_2();
  if (tcp < (uv_tcp_t *)0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x3378a0;
  }
  pcStack_368 = read_cb;
  alloc_cb_cold_1();
  if (handle == (uv_handle_t *)0x0) {
    puStack_370 = (uv_loop_t *)0x170c1f;
    read_cb_cold_4();
LAB_00170c1f:
    puStack_370 = (uv_loop_t *)0x170c24;
    read_cb_cold_2();
LAB_00170c24:
    puStack_370 = (uv_loop_t *)0x170c29;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)tcp) {
      if ((uv_tcp_t *)tcp != (uv_tcp_t *)0x4) goto LAB_00170c1f;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        return extraout_EAX_01;
      }
      goto LAB_00170c24;
    }
    if ((uv_tcp_t *)tcp == (uv_tcp_t *)0xfffffffffffff001) {
      uv_close(handle,close_cb);
      return extraout_EAX_02;
    }
  }
  puStack_370 = (uv_loop_t *)run_test_tcp_write_ready;
  read_cb_cold_1();
  loop_01 = (uv_connect_t *)0x1a4b5a;
  uVar1 = 0x23a3;
  puStack_388 = (uv_loop_t *)0x170c47;
  puStack_370 = puVar3;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_380);
  if (iVar2 == 0) {
    puStack_388 = (uv_loop_t *)0x170c54;
    sock_00 = create_tcp_socket();
    puVar3 = (uv_loop_t *)(ulong)sock_00;
    puStack_388 = (uv_loop_t *)0x170c5b;
    loop_01 = (uv_connect_t *)uv_default_loop();
    uVar1 = 0x337620;
    puStack_388 = (uv_loop_t *)0x170c6a;
    iVar2 = uv_tcp_init((uv_loop_t *)loop_01,&::client);
    if (iVar2 != 0) goto LAB_00170d2a;
    puVar6 = &::client;
    puStack_388 = (uv_loop_t *)0x170c80;
    iVar2 = uv_tcp_open(&::client,sock_00);
    loop_01 = (uv_connect_t *)puVar6;
    if (iVar2 != 0) goto LAB_00170d2f;
    loop_01 = &connect_req;
    sock_00 = 0x337620;
    puStack_388 = (uv_loop_t *)0x170ca5;
    iVar2 = uv_tcp_connect(&connect_req,&::client,(sockaddr *)&sStack_380,connect1_cb);
    if (iVar2 != 0) goto LAB_00170d34;
    puStack_388 = (uv_loop_t *)0x170cb2;
    loop_01 = (uv_connect_t *)uv_default_loop();
    sock_00 = 0;
    puStack_388 = (uv_loop_t *)0x170cbc;
    uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    if (shutdown_cb_called != 1) goto LAB_00170d39;
    if (shutdown_requested != 1) goto LAB_00170d3e;
    if (connect_cb_called != 1) goto LAB_00170d43;
    if (write_cb_called < 1) goto LAB_00170d48;
    if (close_cb_called != 1) goto LAB_00170d4d;
    puStack_388 = (uv_loop_t *)0x170cee;
    puVar3 = uv_default_loop();
    puStack_388 = (uv_loop_t *)0x170d02;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    sock_00 = 0;
    puStack_388 = (uv_loop_t *)0x170d0c;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_388 = (uv_loop_t *)0x170d11;
    loop_01 = (uv_connect_t *)uv_default_loop();
    puStack_388 = (uv_loop_t *)0x170d19;
    iVar2 = uv_loop_close((uv_loop_t *)loop_01);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_388 = (uv_loop_t *)0x170d2a;
    run_test_tcp_write_ready_cold_1();
LAB_00170d2a:
    sock_00 = uVar1;
    puStack_388 = (uv_loop_t *)0x170d2f;
    run_test_tcp_write_ready_cold_2();
LAB_00170d2f:
    puStack_388 = (uv_loop_t *)0x170d34;
    run_test_tcp_write_ready_cold_3();
LAB_00170d34:
    puStack_388 = (uv_loop_t *)0x170d39;
    run_test_tcp_write_ready_cold_4();
LAB_00170d39:
    puStack_388 = (uv_loop_t *)0x170d3e;
    run_test_tcp_write_ready_cold_5();
LAB_00170d3e:
    puStack_388 = (uv_loop_t *)0x170d43;
    run_test_tcp_write_ready_cold_6();
LAB_00170d43:
    puStack_388 = (uv_loop_t *)0x170d48;
    run_test_tcp_write_ready_cold_7();
LAB_00170d48:
    puStack_388 = (uv_loop_t *)0x170d4d;
    run_test_tcp_write_ready_cold_8();
LAB_00170d4d:
    puStack_388 = (uv_loop_t *)0x170d52;
    run_test_tcp_write_ready_cold_9();
  }
  puStack_388 = (uv_loop_t *)connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar4 = (uv_loop_t *)connect_req.handle;
  puStack_388 = puVar3;
  if (loop_01 == &connect_req) {
    loop = (uv_timer_t *)loop_01;
    if (sock_00 != 0) goto LAB_00170e1d;
    connect_cb_called = connect_cb_called + 1;
    loop = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_timer_init((uv_loop_t *)loop,&tm);
    if (iVar2 != 0) goto LAB_00170e22;
    loop = &tm;
    iVar2 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar2 != 0) goto LAB_00170e27;
    uStack_398 = uv_buf_init("P",1);
    puVar5 = &write_req;
    iVar2 = uv_write(&write_req,(uv_stream_t *)puVar4,&uStack_398,1,write1_cb);
    loop = (uv_timer_t *)puVar5;
    if (iVar2 == 0) {
      iVar2 = uv_read_start((uv_stream_t *)puVar4,alloc_cb,read1_cb);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_00170e31;
    }
  }
  else {
    connect1_cb_cold_1();
    loop = (uv_timer_t *)loop_01;
LAB_00170e1d:
    connect1_cb_cold_2();
LAB_00170e22:
    connect1_cb_cold_3();
LAB_00170e27:
    connect1_cb_cold_4();
  }
  puVar4 = (uv_loop_t *)loop;
  connect1_cb_cold_5();
LAB_00170e31:
  connect1_cb_cold_6();
  iVar2 = uv_is_closing((uv_handle_t *)puVar4);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(tcp_open_twice) {
  uv_tcp_t client;
  uv_os_sock_t sock1, sock2;
  int r;

  startup();
  sock1 = create_tcp_socket();
  sock2 = create_tcp_socket();

  r = uv_tcp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock1);
  ASSERT(r == 0);

  r = uv_tcp_open(&client, sock2);
  ASSERT(r == UV_EBUSY);
  close_socket(sock2);

  uv_close((uv_handle_t*) &client, NULL);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}